

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

uint8_t __thiscall wabt::DataSegment::GetFlags(DataSegment *this,Module *module)

{
  int iVar1;
  uint8_t uVar2;
  Index IVar3;
  
  iVar1 = *(int *)this;
  IVar3 = BindingHash::FindIndex(&module->memory_bindings,(Var *)(this + 0x28));
  uVar2 = (iVar1 == 1) + '\x02';
  if (IVar3 == 0) {
    uVar2 = iVar1 == 1;
  }
  return uVar2;
}

Assistant:

uint8_t DataSegment::GetFlags(const Module* module) const {
  uint8_t flags = 0;

  if (kind == SegmentKind::Passive) {
    flags |= SegPassive;
  }

  Index memory_index = module->GetMemoryIndex(memory_var);
  if (memory_index != 0) {
    flags |= SegExplicitIndex;
  }

  return flags;
}